

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_stmt_explain(sqlite3_stmt *pStmt,int eMode)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  
  if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  uVar1 = *(uint *)(pStmt + 200);
  iVar3 = 0;
  if (((((uVar1 >> 2 & 3) != eMode) && (iVar3 = 1, (uint)eMode < 3)) && ((char)pStmt[0xc6] < '\0'))
     && (iVar3 = 5, pStmt[199] == (sqlite3_stmt)0x1)) {
    if ((*(int *)(pStmt + 0x24) < 10) || (eMode == 2 && (uVar1 >> 8 & 1) == 0)) {
      *(ushort *)(pStmt + 200) = (ushort)uVar1 & 0xfff3 | (short)eMode * 4;
      iVar3 = sqlite3Reprepare((Vdbe *)pStmt);
      uVar2 = (ushort)*(undefined4 *)(pStmt + 200) & 0xfeff | (ushort)(eMode == 2) << 8;
    }
    else {
      uVar2 = (ushort)uVar1 & 0xfff3 | (ushort)(eMode << 2);
      iVar3 = 0;
    }
    *(ushort *)(pStmt + 200) = uVar2;
  }
  uVar2 = *(ushort *)(pStmt + 200) >> 2 & 3;
  if (uVar2 == 0) {
    uVar2 = *(ushort *)(pStmt + 0xc2);
  }
  else {
    uVar2 = uVar2 << 2 ^ 0xc;
  }
  *(ushort *)(pStmt + 0xc0) = uVar2;
  if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_stmt_explain(sqlite3_stmt *pStmt, int eMode){
  Vdbe *v = (Vdbe*)pStmt;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(v->db->mutex);
  if( ((int)v->explain)==eMode ){
    rc = SQLITE_OK;
  }else if( eMode<0 || eMode>2 ){
    rc = SQLITE_ERROR;
  }else if( (v->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ){
    rc = SQLITE_ERROR;
  }else if( v->eVdbeState!=VDBE_READY_STATE ){
    rc = SQLITE_BUSY;
  }else if( v->nMem>=10 && (eMode!=2 || v->haveEqpOps) ){
    /* No reprepare necessary */
    v->explain = eMode;
    rc = SQLITE_OK;
  }else{
    v->explain = eMode;
    rc = sqlite3Reprepare(v);
    v->haveEqpOps = eMode==2;
  }
  if( v->explain ){
    v->nResColumn = 12 - 4*v->explain;
  }else{
    v->nResColumn = v->nResAlloc;
  }
  sqlite3_mutex_leave(v->db->mutex);
  return rc;
}